

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O3

void __thiscall wasm::TypeBuilder::setHeapType(TypeBuilder *this,size_t i,Struct *struct_)

{
  _Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false> _Var1;
  long lVar2;
  HeapTypeInfo local_50;
  
  _Var1._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
       .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
  lVar2 = *(long *)&((_Var1._M_head_impl)->entries).
                    super__Vector_base<wasm::TypeBuilder::Impl::Entry,_std::allocator<wasm::TypeBuilder::Impl::Entry>_>
  ;
  if (i < (ulong)((long)*(pointer *)((long)&(_Var1._M_head_impl)->entries + 8) - lVar2 >> 4)) {
    local_50.isTemp = false;
    local_50.isFinalized = true;
    local_50.supertype = (HeapTypeInfo *)0x0;
    local_50.recGroup = (RecGroupInfo *)0x0;
    local_50.recGroupIndex = 0;
    local_50.kind = StructKind;
    std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
              ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)&local_50.field_6.signature,
               &struct_->fields);
    Impl::Entry::set((Entry *)(lVar2 + i * 0x10),&local_50);
    anon_unknown_0::HeapTypeInfo::~HeapTypeInfo(&local_50);
    return;
  }
  __assert_fail("i < size() && \"index out of bounds\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-type.cpp"
                ,0x998,"void wasm::TypeBuilder::setHeapType(size_t, Struct &&)");
}

Assistant:

void TypeBuilder::setHeapType(size_t i, Struct&& struct_) {
  assert(i < size() && "index out of bounds");
  impl->entries[i].set(std::move(struct_));
}